

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::RsCaseSyntax::RsCaseSyntax
          (RsCaseSyntax *this,Token keyword,Token openParen,ExpressionSyntax *expr,Token closeParen,
          SyntaxList<slang::syntax::RsCaseItemSyntax> *items,Token endcase)

{
  pointer ppRVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar5 = openParen._0_8_;
  uVar7 = keyword._0_8_;
  (this->super_RsProdSyntax).super_SyntaxNode.kind = RsCase;
  (this->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_RsProdSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->keyword).kind = (short)uVar7;
  (this->keyword).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  (this->expr).ptr = expr;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00596408;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar2 = (items->super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (items->super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0059a540;
  (this->endcase).kind = endcase.kind;
  (this->endcase).field_0x2 = endcase._2_1_;
  (this->endcase).numFlags = (NumericTokenFlags)endcase.numFlags.raw;
  (this->endcase).rawLen = endcase.rawLen;
  (this->endcase).info = endcase.info;
  (expr->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppRVar1 = (this->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  sVar2 = (this->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(RsCaseSyntax **)(*(long *)((long)ppRVar1 + lVar6) + 8) = this;
  }
  return;
}

Assistant:

RsCaseSyntax(Token keyword, Token openParen, ExpressionSyntax& expr, Token closeParen, const SyntaxList<RsCaseItemSyntax>& items, Token endcase) :
        RsProdSyntax(SyntaxKind::RsCase), keyword(keyword), openParen(openParen), expr(&expr), closeParen(closeParen), items(items), endcase(endcase) {
        this->expr->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }